

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O3

void __thiscall
vkt::synchronization::anon_unknown_0::IndirectBuffer::ReadSupport::initPrograms
          (ReadSupport *this,SourceCollections *programCollection)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  ProgramSources *pPVar6;
  ostringstream src;
  ostringstream main;
  ostringstream decl;
  undefined1 auStack_508 [8];
  string local_500;
  uint local_4e0;
  undefined4 uStack_4dc;
  value_type local_4d8;
  long *local_4b8;
  long local_4b0;
  long local_4a8 [2];
  long local_498 [14];
  ios_base local_428 [264];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(set = 0, binding = 0, std140) coherent buffer Data {\n",
             0x3c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    uint value;\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"} sb_out;\n",10);
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"    atomicAdd(sb_out.value, 1u);\n",0x21);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_508 + (int)*(undefined8 *)(local_498[0] + -0x18) + 0x70);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_498,"layout(location = 0) in vec4 v_in_position;\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"out ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_498,"gl_PerVertex {\n    vec4 gl_Position;\n}",0x26);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"\n",1);
  std::__cxx11::stringbuf::str();
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_498,(char *)CONCAT44(uStack_4dc,local_4e0),
                      (long)local_4d8._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"    gl_Position = v_in_position;\n",0x21);
  std::__cxx11::stringbuf::str();
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_500._M_dataplus._M_p,local_500._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
  paVar1 = &local_500.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar1) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if ((size_type *)CONCAT44(uStack_4dc,local_4e0) != &local_4d8._M_string_length) {
    operator_delete((undefined1 *)CONCAT44(uStack_4dc,local_4e0),local_4d8._M_string_length + 1);
  }
  local_500._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"read_ib_vert","");
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_500);
  std::__cxx11::stringbuf::str();
  local_4e0 = 0;
  paVar2 = &local_4d8.field_2;
  local_4d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d8,local_4b8,local_4b0 + (long)local_4b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar6->sources + local_4e0,&local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if (local_4b8 != local_4a8) {
    operator_delete(local_4b8,local_4a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar1) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_508 + (int)*(undefined8 *)(local_498[0] + -0x18) + 0x70);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_498,"layout(location = 0) out vec4 o_color;\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_498,"    o_color = vec4(1.0);\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"}\n",2);
  local_500._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"read_ib_frag","");
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_500);
  std::__cxx11::stringbuf::str();
  local_4e0 = 1;
  local_4d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d8,local_4b8,local_4b0 + (long)local_4b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar6->sources + local_4e0,&local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if (local_4b8 != local_4a8) {
    operator_delete(local_4b8,local_4a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar1) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_508 + (int)*(undefined8 *)(local_498[0] + -0x18) + 0x70);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_498,"layout(local_size_x = 1) in;\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"\n",1);
  std::__cxx11::stringbuf::str();
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_498,(char *)CONCAT44(uStack_4dc,local_4e0),
                      (long)local_4d8._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
  std::__cxx11::stringbuf::str();
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_500._M_dataplus._M_p,local_500._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar1) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if ((size_type *)CONCAT44(uStack_4dc,local_4e0) != &local_4d8._M_string_length) {
    operator_delete((undefined1 *)CONCAT44(uStack_4dc,local_4e0),local_4d8._M_string_length + 1);
  }
  local_500._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"read_ib_comp","");
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_500);
  std::__cxx11::stringbuf::str();
  local_4e0 = 5;
  local_4d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d8,local_4b8,local_4b0 + (long)local_4b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar6->sources + local_4e0,&local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if (local_4b8 != local_4a8) {
    operator_delete(local_4b8,local_4a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar1) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection) const
	{
		std::ostringstream decl;
		decl << "layout(set = 0, binding = 0, std140) coherent buffer Data {\n"
			 << "    uint value;\n"
			 << "} sb_out;\n";

		std::ostringstream main;
		main << "    atomicAdd(sb_out.value, 1u);\n";

		// Vertex
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
				<< "\n"
				<< "layout(location = 0) in vec4 v_in_position;\n"
				<< "\n"
				<< "out " << s_perVertexBlock << ";\n"
				<< "\n"
				<< decl.str()
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "    gl_Position = v_in_position;\n"
				<< main.str()
				<< "}\n";

			programCollection.glslSources.add("read_ib_vert") << glu::VertexSource(src.str());
		}

		// Fragment
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
				<< "\n"
				<< "layout(location = 0) out vec4 o_color;\n"
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "    o_color = vec4(1.0);\n"
				<< "}\n";

			programCollection.glslSources.add("read_ib_frag") << glu::FragmentSource(src.str());
		}

		// Compute
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
				<< "\n"
				<< "layout(local_size_x = 1) in;\n"
				<< "\n"
				<< decl.str()
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< main.str()
				<< "}\n";

			programCollection.glslSources.add("read_ib_comp") << glu::ComputeSource(src.str());
		}
	}